

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsortL.c
# Opt level: O2

int bursttraverseL(TRIE *node,uchar **strings,int pos,int deep)

{
  trierec *ptVar1;
  trierec **pptVar2;
  int deep_00;
  uint uVar3;
  uint n;
  long lVar4;
  
  deep_00 = deep + 1;
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    pptVar2 = node->ptrs + lVar4;
    if (node->counts[lVar4] < 0) {
      uVar3 = bursttraverseL(*pptVar2,strings,pos,deep_00);
    }
    else {
      n = 0;
      while( true ) {
        uVar3 = pos + n;
        ptVar1 = *pptVar2;
        if (ptVar1 == (trierec *)0x0) break;
        strings[uVar3] = (uchar *)ptVar1->ptrs[0];
        pptVar2 = ptVar1->ptrs + 1;
        n = n + 1;
      }
      if (1 < n && lVar4 != 0) {
        if (n < 0x14) {
          inssort(strings + pos,n,deep_00);
        }
        else {
          mkqsort(strings + pos,n,deep_00);
        }
      }
    }
    pos = uVar3;
  }
  free(node);
  return pos;
}

Assistant:

static int
bursttraverseL(TRIE *node, unsigned char **strings, int pos, int deep)
{
    LIST	*l;
    unsigned int i, off;
    unsigned int sizeOfContainer = 0;

    for( i=0 ; i<ALPHABET ; i++ )
    {
        if( node->counts[i]<0 )
        {
            pos = bursttraverseL(node->ptrs[i], strings, pos, deep+1);
	    }
        else
        {
            for( off=pos, l=(LIST *) node->ptrs[i] ; l!=NULL ; off++, l=l->next )
            {
                strings[off] = l->word;
            }
            sizeOfContainer = (off - pos); 

            if( i>0 && sizeOfContainer > 1 )
            {
                if (sizeOfContainer < INSERTBREAK)
                    inssort( strings+pos, off-pos, deep + 1);     
                else
                    mkqsort( strings+pos, off-pos, deep + 1);
            }
            pos = off;
        }
    }
    free(node);
    return pos;
}